

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid_Image.cxx
# Opt level: O3

void __thiscall Fluid_Image::write_static(Fluid_Image *this)

{
  Fl_Shared_Image *pFVar1;
  bool bVar2;
  int iVar3;
  undefined8 in_RAX;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  ulong uVar7;
  FILE *__stream;
  int iVar8;
  ulong uVar9;
  int ncolors;
  int chars_per_color;
  
  if (this->img != (Fl_Shared_Image *)0x0) {
    _ncolors = in_RAX;
    pcVar4 = fl_filename_name(this->name_);
    pcVar4 = unique_id(this,"idata",pcVar4,(char *)0x0);
    pcVar5 = fl_filename_name(this->name_);
    pcVar5 = unique_id(this,"image",pcVar5,(char *)0x0);
    this->function_name_ = pcVar5;
    if ((this->img->super_Fl_Image).count_ < 2) {
      if ((this->img->super_Fl_Image).d_ == 0) {
        write_c("\n");
        if (bitmap_header_written != write_number) {
          write_c("#include <FL/Fl_Bitmap.H>\n");
          bitmap_header_written = write_number;
        }
        write_c("static const unsigned char %s[] =\n",pcVar4);
        pFVar1 = this->img;
        iVar8 = (pFVar1->super_Fl_Image).w_;
        iVar3 = iVar8 + 7;
        iVar8 = iVar8 + 0xe;
        if (-1 < iVar3) {
          iVar8 = iVar3;
        }
        write_cdata(*(pFVar1->super_Fl_Image).data_,(iVar8 >> 3) * (pFVar1->super_Fl_Image).h_);
        write_c(";\n");
        write_initializer(this,"Fl_Bitmap","%s, %d, %d",pcVar4,
                          (ulong)(uint)(this->img->super_Fl_Image).w_,
                          (ulong)(uint)(this->img->super_Fl_Image).h_);
        return;
      }
      pcVar5 = fl_filename_ext(this->name_);
      iVar3 = strcmp(pcVar5,".jpg");
      write_c("\n");
      if (iVar3 == 0) {
        if (jpeg_header_written != write_number) {
          write_c("#include <FL/Fl_JPEG_Image.H>\n");
          jpeg_header_written = write_number;
        }
        write_c("static const unsigned char %s[] =\n",pcVar4);
        __stream = (FILE *)fl_fopen(this->name_,"rb");
        if (__stream != (FILE *)0x0) {
          fseek(__stream,0,2);
          sVar6 = ftell(__stream);
          fseek(__stream,0,0);
          if (sVar6 != 0) {
            pcVar5 = (char *)calloc(sVar6,1);
            fread(pcVar5,sVar6,1,__stream);
            write_cdata(pcVar5,(int)sVar6);
            free(pcVar5);
          }
          fclose(__stream);
        }
        write_c(";\n");
        pcVar5 = fl_filename_name(this->name_);
        write_initializer(this,"Fl_JPEG_Image","\"%s\", %s",pcVar5,pcVar4);
        return;
      }
      if (image_header_written != write_number) {
        write_c("#include <FL/Fl_Image.H>\n");
        image_header_written = write_number;
      }
      write_c("static const unsigned char %s[] =\n",pcVar4);
      pFVar1 = this->img;
      iVar3 = (pFVar1->super_Fl_Image).ld_;
      iVar8 = (pFVar1->super_Fl_Image).d_ * (pFVar1->super_Fl_Image).w_;
      if (iVar3 != 0) {
        iVar8 = iVar3;
      }
      write_cdata(*(pFVar1->super_Fl_Image).data_,iVar8 * (pFVar1->super_Fl_Image).h_);
      write_c(";\n");
      pFVar1 = this->img;
      write_initializer(this,"Fl_RGB_Image","%s, %d, %d, %d, %d",pcVar4,
                        (ulong)(uint)(pFVar1->super_Fl_Image).w_,
                        (ulong)(uint)(pFVar1->super_Fl_Image).h_,
                        (ulong)(uint)(pFVar1->super_Fl_Image).d_,
                        (ulong)(uint)(pFVar1->super_Fl_Image).ld_);
    }
    else {
      write_c("\n");
      if (pixmap_header_written != write_number) {
        write_c("#include <FL/Fl_Pixmap.H>\n");
        pixmap_header_written = write_number;
      }
      write_c("static const char *%s[] = {\n",pcVar4);
      pcVar5 = *(this->img->super_Fl_Image).data_;
      sVar6 = strlen(pcVar5);
      write_cstring(pcVar5,(int)sVar6);
      __isoc99_sscanf(*(this->img->super_Fl_Image).data_,"%*d%*d%d%d",&ncolors,&chars_per_color);
      if (ncolors < 0) {
        write_c(",\n");
        write_cstring((this->img->super_Fl_Image).data_[1],ncolors * -4);
        uVar9 = 2;
      }
      else if (ncolors == 0) {
        uVar9 = 1;
      }
      else {
        uVar7 = 1;
        do {
          write_c(",\n");
          pcVar5 = (this->img->super_Fl_Image).data_[uVar7];
          sVar6 = strlen(pcVar5);
          write_cstring(pcVar5,(int)sVar6);
          uVar9 = uVar7 + 1;
          bVar2 = (long)uVar7 < (long)ncolors;
          uVar7 = uVar9;
        } while (bVar2);
      }
      if ((int)uVar9 < (this->img->super_Fl_Image).count_) {
        uVar9 = uVar9 & 0xffffffff;
        do {
          write_c(",\n");
          write_cstring((this->img->super_Fl_Image).data_[uVar9],
                        chars_per_color * (this->img->super_Fl_Image).w_);
          uVar9 = uVar9 + 1;
        } while ((int)uVar9 < (this->img->super_Fl_Image).count_);
      }
      write_c("\n};\n");
      write_initializer(this,"Fl_Pixmap","%s",pcVar4);
    }
  }
  return;
}

Assistant:

void Fluid_Image::write_static() {
  if (!img) return;
  const char *idata_name = unique_id(this, "idata", fl_filename_name(name()), 0);
  function_name_ = unique_id(this, "image", fl_filename_name(name()), 0);
  if (img->count() > 1) {
    // Write Pixmap data...
    write_c("\n");
    if (pixmap_header_written != write_number) {
      write_c("#include <FL/Fl_Pixmap.H>\n");
      pixmap_header_written = write_number;
    }
    write_c("static const char *%s[] = {\n", idata_name);
    write_cstring(img->data()[0], strlen(img->data()[0]));

    int i;
    int ncolors, chars_per_color;
    sscanf(img->data()[0], "%*d%*d%d%d", &ncolors, &chars_per_color);

    if (ncolors < 0) {
      write_c(",\n");
      write_cstring(img->data()[1], ncolors * -4);
      i = 2;
    } else {
      for (i = 1; i <= ncolors; i ++) {
        write_c(",\n");
        write_cstring(img->data()[i], strlen(img->data()[i]));
      }
    }
    for (; i < img->count(); i ++) {
      write_c(",\n");
      write_cstring(img->data()[i], img->w() * chars_per_color);
    }
    write_c("\n};\n");
    write_initializer("Fl_Pixmap", "%s", idata_name);
  } else if (img->d() == 0) {
    // Write Bitmap data...
    write_c("\n");
    if (bitmap_header_written != write_number) {
      write_c("#include <FL/Fl_Bitmap.H>\n");
      bitmap_header_written = write_number;
    }
    write_c("static const unsigned char %s[] =\n", idata_name);
    write_cdata(img->data()[0], ((img->w() + 7) / 8) * img->h());
    write_c(";\n");
    write_initializer( "Fl_Bitmap", "%s, %d, %d", idata_name, img->w(), img->h());
  } else if (strcmp(fl_filename_ext(name()), ".jpg")==0) {
    // Write jpeg image data...
    write_c("\n");
    if (jpeg_header_written != write_number) {
      write_c("#include <FL/Fl_JPEG_Image.H>\n");
      jpeg_header_written = write_number;
    }
    write_c("static const unsigned char %s[] =\n", idata_name);

    FILE *f = fl_fopen(name(), "rb");
    if (!f) {
      // message = "Can't include binary file. Can't open";
    } else {
      fseek(f, 0, SEEK_END);
      size_t nData = ftell(f);
      fseek(f, 0, SEEK_SET);
      if (nData) {
        char *data = (char*)calloc(nData, 1);
        if (fread(data, nData, 1, f)==0) { /* ignore */ }
        write_cdata(data, nData);
        free(data);
      }
      fclose(f);
    }
    
    write_c(";\n");
    write_initializer("Fl_JPEG_Image", "\"%s\", %s", fl_filename_name(name()), idata_name);
  } else {
    // Write image data...
    write_c("\n");
    if (image_header_written != write_number) {
      write_c("#include <FL/Fl_Image.H>\n");
      image_header_written = write_number;
    } 
    write_c("static const unsigned char %s[] =\n", idata_name);
    const int extra_data = img->ld() ? (img->ld()-img->w()*img->d()) : 0;
    write_cdata(img->data()[0], (img->w() * img->d() + extra_data) * img->h());
    write_c(";\n");
    write_initializer("Fl_RGB_Image", "%s, %d, %d, %d, %d", idata_name, img->w(), img->h(), img->d(), img->ld());
  }
}